

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseLineCase::iterate(BaseLineCase *this)

{
  ostringstream *this_00;
  int iVar1;
  char *description;
  IterateResult IVar2;
  qpTestResult testResult;
  char *pcVar3;
  bool bVar4;
  float extraout_XMM0_Da;
  string local_248;
  ScopedLogSection section;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  string iterationDescription;
  RasterizationArguments local_1b8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [23];
  
  local_1b8.numSamples = *(int *)&(this->super_BaseRenderingCase).field_0xc4 + 1;
  de::toString<int>((string *)&drawBuffer,&local_1b8.numSamples);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 "Test iteration ",(string *)&drawBuffer);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultImage,
                 " / ");
  de::toString<int>(&local_248,&this->m_iterationCount);
  std::operator+(&iterationDescription,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 &local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)&resultImage);
  std::__cxx11::string::~string((string *)&drawBuffer);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx)->m_log,&iterationDescription,&iterationDescription);
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5])
            (this);
  iVar1 = (this->super_BaseRenderingCase).m_renderSize;
  tcu::Surface::Surface(&resultImage,iVar1,iVar1);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.field_2._M_allocated_capacity = 0;
  local_248._M_dataplus._M_p = (pointer)0x0;
  local_248._M_string_length = 0;
  if (extraout_XMM0_Da <= this->m_maxLineWidth) {
    (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[7]
    )(this,(ulong)*(uint *)&(this->super_BaseRenderingCase).field_0xc4,&drawBuffer,&local_248);
    BaseRenderingCase::drawPrimitives
              (&this->super_BaseRenderingCase,&resultImage,&drawBuffer,this->m_primitiveDrawType);
    local_1b8.numSamples = (this->super_BaseRenderingCase).m_numSamples;
    local_1b8.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
    local_1b8.redBits = (this->super_BaseRenderingCase).m_pixelFormat.redBits;
    local_1b8.greenBits = (this->super_BaseRenderingCase).m_pixelFormat.greenBits;
    local_1b8.blueBits = (this->super_BaseRenderingCase).m_pixelFormat.blueBits;
    local_198._0_8_ = local_248._M_dataplus._M_p;
    local_198._8_8_ = local_248._M_string_length;
    local_188[0]._M_allocated_capacity = local_248.field_2._M_allocated_capacity;
    local_248.field_2._M_allocated_capacity = 0;
    local_248._M_dataplus._M_p = (pointer)0x0;
    local_248._M_string_length = 0;
    local_188[0]._8_4_ = extraout_XMM0_Da;
    bVar4 = tcu::verifyLineGroupRasterization
                      (&resultImage,(LineSceneSpec *)local_198,&local_1b8,
                       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                       .m_testCtx)->m_log);
    if (((this->super_BaseRenderingCase).m_numSamples < 2 || bVar4) ||
        (float)local_188[0]._8_4_ == 1.0) {
      if (!bVar4) {
        this->m_allIterationsPassed = false;
      }
    }
    else {
      this->m_multisampleRelaxationRequired = true;
    }
    std::_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
    ::~_Vector_base((_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     *)local_198);
  }
  else {
    local_198._0_8_ =
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Line width ");
    std::ostream::operator<<(this_00,extraout_XMM0_Da);
    std::operator<<((ostream *)this_00," not supported, skipping iteration.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  iVar1 = *(int *)&(this->super_BaseRenderingCase).field_0xc4 + 1;
  *(int *)&(this->super_BaseRenderingCase).field_0xc4 = iVar1;
  if (iVar1 == this->m_iterationCount) {
    pcVar3 = "Pass";
    if ((this->m_multisampleRelaxationRequired & 1U) != 0) {
      pcVar3 = "Rasterization of multisampled wide lines failed";
    }
    bVar4 = this->m_allIterationsPassed != false;
    testResult = QP_TEST_RESULT_FAIL;
    if (bVar4) {
      testResult = (this->m_multisampleRelaxationRequired & 1) * 3;
    }
    description = "Incorrect rasterization";
    if (bVar4) {
      description = pcVar3;
    }
    IVar2 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,testResult,description);
  }
  else {
    IVar2 = CONTINUE;
  }
  std::_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
  ~_Vector_base((_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 *)&local_248);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&iterationDescription);
  return IVar2;
}

Assistant:

BaseLineCase::IterateResult BaseLineCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	const float								lineWidth				= getLineWidth();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// supported?
	if (lineWidth <= m_maxLineWidth)
	{
		// gen data
		generateLines(m_iteration, drawBuffer, lines);

		// draw image
		drawPrimitives(resultImage, drawBuffer, m_primitiveDrawType);

		// compare
		{
			bool					compareOk;
			RasterizationArguments	args;
			LineSceneSpec			scene;

			args.numSamples		= m_numSamples;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= getPixelFormat().redBits;
			args.greenBits		= getPixelFormat().greenBits;
			args.blueBits		= getPixelFormat().blueBits;

			scene.lines.swap(lines);
			scene.lineWidth = lineWidth;

			compareOk = verifyLineGroupRasterization(resultImage, scene, args, m_testCtx.getLog());

			// multisampled wide lines might not be supported
			if (scene.lineWidth != 1.0f && m_numSamples > 1 && !compareOk)
			{
				m_multisampleRelaxationRequired = true;
				compareOk = true;
			}

			if (!compareOk)
				m_allIterationsPassed = false;
		}
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Line width " << lineWidth << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed && m_multisampleRelaxationRequired)
			m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Rasterization of multisampled wide lines failed");
		else if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rasterization");

		return STOP;
	}
	else
		return CONTINUE;
}